

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          TwoBSA<unsigned_long> *begin,comm *end,comm *param_5)

{
  bool bVar1;
  int iVar2;
  int rank;
  size_type sVar3;
  unsigned_long n;
  const_reference pvVar4;
  const_reference __y;
  difference_type dVar5;
  reference pvVar6;
  unsigned_long uVar7;
  unsigned_long *puVar8;
  iterator __first;
  iterator __last;
  unsigned_long_long uVar9;
  ulong uVar10;
  pair<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>,___gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>_>
  pVar11;
  byte local_189;
  size_t out_size;
  unsigned_long local_110;
  size_t out_size_1;
  unsigned_long uStack_100;
  uint j;
  size_t eq_size_split;
  TwoBSA<unsigned_long> *local_f0;
  unsigned_long local_e8;
  size_t eq_size;
  size_t local_d8;
  TwoBSA<unsigned_long> *local_c8;
  size_t local_c0;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_b8;
  pair<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>,___gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>_>
  eqr;
  int iStack_a0;
  uint split_by;
  size_t i;
  block_decomposition<unsigned_long> local_part;
  size_t local_size;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  pos;
  allocator<unsigned_long> local_49;
  value_type_conflict1 local_48;
  byte local_39;
  comm *local_38;
  comm *comm_local;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *splitters_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_20;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  end_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  begin_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_counts;
  
  local_38 = param_5;
  comm_local = end;
  local_20._M_current = begin;
  end_local._M_current = (TwoBSA<unsigned_long> *)this;
  sVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)end);
  iVar2 = mxx::comm::size(local_38);
  if (sVar3 != (long)iVar2 - 1U) {
    assert_fail("splitters.size() == (size_t)comm.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0xe9,"split");
  }
  local_39 = 0;
  iVar2 = mxx::comm::size(local_38);
  local_48 = 0;
  std::allocator<unsigned_long>::allocator(&local_49);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)iVar2,&local_48,&local_49);
  std::allocator<unsigned_long>::~allocator(&local_49);
  local_size = (size_t)end_local._M_current;
  local_part._16_8_ = local_20._M_current;
  n = std::
      distance<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                (end_local,local_20);
  iVar2 = mxx::comm::size(local_38);
  rank = mxx::comm::rank(local_38);
  partition::block_decomposition<unsigned_long>::block_decomposition
            ((block_decomposition<unsigned_long> *)&i,n,iVar2,rank);
  for (_iStack_a0 = 0;
      sVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size
                        ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         comm_local), _iStack_a0 < sVar3;
      _iStack_a0 = eqr.second._M_current._4_4_ + _iStack_a0) {
    eqr.second._M_current._4_4_ = 1;
    while( true ) {
      uVar10 = (ulong)eqr.second._M_current._4_4_;
      sVar3 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::size
                        ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         comm_local);
      local_189 = 0;
      if (_iStack_a0 + uVar10 < sVar3) {
        pvVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                 operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)comm_local,_iStack_a0);
        __y = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
              operator[]((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         comm_local,_iStack_a0 + eqr.second._M_current._4_4_);
        bVar1 = std::less<TwoBSA<unsigned_long>_>::operator()
                          ((less<TwoBSA<unsigned_long>_> *)((long)&splitters_local + 7),pvVar4,__y);
        local_189 = bVar1 ^ 0xff;
      }
      if ((local_189 & 1) == 0) break;
      eqr.second._M_current._4_4_ = eqr.second._M_current._4_4_ + 1;
    }
    local_c0 = local_size;
    local_c8 = local_20._M_current;
    pvVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator[]
                       ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                        comm_local,_iStack_a0);
    pVar11 = std::
             equal_range<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,TwoBSA<unsigned_long>,std::less<TwoBSA<unsigned_long>>>
                       (local_c0,local_c8,pvVar4);
    eqr.first = pVar11.second._M_current;
    eq_size = (size_t)pVar11.first._M_current;
    local_d8 = local_size;
    local_b8._M_current = (TwoBSA<unsigned_long> *)eq_size;
    dVar5 = std::
            distance<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                      ((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                        )local_size,
                       (__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                        )eq_size);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,_iStack_a0);
    *pvVar6 = *pvVar6 + dVar5;
    local_f0 = local_b8._M_current;
    eq_size_split = (size_t)eqr.first._M_current;
    uVar7 = std::
            distance<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                      (local_b8,eqr.first);
    local_e8 = uVar7;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,_iStack_a0);
    uStack_100 = (uVar7 + *pvVar6) / (ulong)(eqr.second._M_current._4_4_ + 1) + 1;
    for (out_size_1._4_4_ = 0; uVar7 = local_e8, out_size_1._4_4_ < eqr.second._M_current._4_4_;
        out_size_1._4_4_ = out_size_1._4_4_ + 1) {
      local_110 = 0;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,_iStack_a0 + out_size_1._4_4_);
      uVar10 = *pvVar6;
      uVar7 = partition::block_decomposition<unsigned_long>::local_size
                        ((block_decomposition<unsigned_long> *)&i,iStack_a0 + out_size_1._4_4_);
      if (uVar10 < uVar7) {
        uVar7 = partition::block_decomposition<unsigned_long>::local_size
                          ((block_decomposition<unsigned_long> *)&i,iStack_a0 + out_size_1._4_4_);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (__return_storage_ptr__,_iStack_a0 + out_size_1._4_4_);
        out_size = uVar7 - *pvVar6;
        puVar8 = std::max<unsigned_long>(&out_size,&stack0xffffffffffffff00);
        puVar8 = std::min<unsigned_long>(puVar8,&local_e8);
        local_110 = *puVar8;
        local_e8 = local_e8 - local_110;
      }
      uVar7 = local_110;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,_iStack_a0 + out_size_1._4_4_);
      *pvVar6 = uVar7 + *pvVar6;
    }
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,_iStack_a0 + eqr.second._M_current._4_4_);
    *pvVar6 = uVar7 + *pvVar6;
    local_size = (size_t)eqr.first._M_current;
  }
  dVar5 = std::
          distance<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                    ((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                      )local_size,local_20);
  iVar2 = mxx::comm::size(local_38);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (__return_storage_ptr__,(long)(iVar2 + -1));
  *pvVar6 = *pvVar6 + dVar5;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      (__return_storage_ptr__);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__);
  uVar9 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_long>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__last._M_current,0);
  if (uVar9 != n) {
    assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0x114,"split");
  }
  local_39 = 1;
  partition::block_decomposition<unsigned_long>::~block_decomposition
            ((block_decomposition<unsigned_long> *)&i);
  if ((local_39 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    partition::block_decomposition<std::size_t> local_part(local_size, comm.size(), comm.rank());
    for (std::size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        std::size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        std::size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            // TODO: this kind of splitting is not `stable` (need other strategy
            // to mak such splitting stable across processors)
            std::size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    std::size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size);
    return send_counts;
}